

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O0

void print_pkt(packet_t *pkt)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  char *pcVar6;
  double in_XMM0_Qa;
  int local_1c;
  int local_18;
  int i_2;
  int i_1;
  int i;
  packet_t *pkt_local;
  
  if (pkt == (packet_t *)0x0) {
    _log(in_XMM0_Qa);
  }
  else {
    printf("--------------------------------------------------\n");
    printf("[PACKET] len: %-5d offset: %-5d payload: %-5d\n\n",(ulong)(uint)pkt->len,
           (ulong)(uint)pkt->offset,(ulong)(uint)pkt->payload);
    for (i_2 = 0; i_2 < pkt->len; i_2 = i_2 + 1) {
      printf(" %02X",(ulong)pkt->data[i_2]);
      if ((i_2 + 1) % 0x10 == 0) {
        printf("\n");
      }
    }
    printf("\n\n");
    printf("iface\t\t: %s -> %s\n",&pkt->iface,(pkt->iface).out);
    pcVar6 = map_int_get_k((uint)pkt->state,m_state);
    printf("state\t\t: %s\n",pcVar6);
    if (pkt->eth_type != 0) {
      printf("ether type\t: 0x%04x\n",(ulong)pkt->eth_type);
      printf("src mac\t\t: %02X:%02X:%02X:%02X:%02X:%02X\n",(ulong)pkt->eth->src[0],
             (ulong)pkt->eth->src[1],(ulong)pkt->eth->src[2],(ulong)pkt->eth->src[3],
             (ulong)pkt->eth->src[4],(uint)pkt->eth->src[5]);
      printf("dst mac\t\t: %02X:%02X:%02X:%02X:%02X:%02X\n",(ulong)pkt->eth->dst[0],
             (ulong)pkt->eth->dst[1],(ulong)pkt->eth->dst[2],(ulong)pkt->eth->dst[3],
             (ulong)pkt->eth->dst[4],(uint)pkt->eth->dst[5]);
    }
    if (pkt->eth_type == 0x800) {
      uVar1 = ntohs(pkt->ip->frag);
      printf("IP frag\t\t: %d\n",(ulong)(uVar1 & 0x1fff));
      uVar2 = ntohl(pkt->ip->src);
      uVar3 = ntohl(pkt->ip->src);
      uVar4 = ntohl(pkt->ip->src);
      uVar5 = ntohl(pkt->ip->src);
      printf("src ip\t\t: %u.%u.%u.%u\n",(ulong)(uVar2 >> 0x18),(ulong)(uVar3 >> 0x10 & 0xff),
             (ulong)(uVar4 >> 8 & 0xff),(ulong)(uVar5 & 0xff));
      uVar2 = ntohl(pkt->ip->dst);
      uVar3 = ntohl(pkt->ip->dst);
      uVar4 = ntohl(pkt->ip->dst);
      uVar5 = ntohl(pkt->ip->dst);
      printf("dst ip\t\t: %u.%u.%u.%u\n",(ulong)(uVar2 >> 0x18),(ulong)(uVar3 >> 0x10 & 0xff),
             (ulong)(uVar4 >> 8 & 0xff),(ulong)(uVar5 & 0xff));
    }
    if (pkt->ip_proto == '\x06') {
      printf("TCP flag\t: ");
      local_18 = 0;
      while (m_tcp_flag[local_18].k != (char *)0x0) {
        if (((uint)pkt->tcp->flag & m_tcp_flag[local_18].v) != 0) {
          printf("[%s]",m_tcp_flag[local_18].k);
        }
        local_18 = local_18 + 1;
      }
      printf("\n");
      uVar1 = ntohs(pkt->tcp->src);
      printf("src port\t: %u\n",(ulong)uVar1);
      uVar1 = ntohs(pkt->tcp->dst);
      printf("dst port\t: %u\n",(ulong)uVar1);
    }
    else if (pkt->ip_proto == '\x11') {
      printf("UDP\n");
      uVar1 = ntohs(pkt->udp->src);
      printf("src port\t: %u\n",(ulong)uVar1);
      uVar1 = ntohs(pkt->udp->dst);
      printf("dst port\t: %u\n",(ulong)uVar1);
    }
    if (0 < pkt->payload) {
      printf("--------------------------------------------------\n");
      for (local_1c = pkt->offset; local_1c < pkt->len; local_1c = local_1c + 1) {
        printf("%c",(ulong)pkt->data[local_1c]);
      }
      printf("\n");
    }
    printf("--------------------------------------------------\n");
  }
  return;
}

Assistant:

void print_pkt(packet_t *pkt)
{
	if (pkt == NULL) {
		log_err("%s pkt is null\n", __FUNCTION__);
		return;
	}

	printf("--------------------------------------------------\n");

	printf("[PACKET] len: %-5d offset: %-5d payload: %-5d\n\n", pkt->len, pkt->offset, pkt->payload);

	for (int i = 0; i < pkt->len; i++) {
		printf(" %02X", pkt->data[i]);

		if ((i + 1) % 16 == 0) {
			printf("\n");
		}
	}

	printf("\n\n");

	printf("iface		: %s -> %s\n", pkt->iface.in, pkt->iface.out);
	printf("state		: %s\n", map_int_get_k(pkt->state, m_state));

	if (pkt->eth_type) {
		printf("ether type	: 0x%04x\n", pkt->eth_type);
		printf("src mac		: "MAC_FORMAT"\n", MAC_PRINT(pkt->eth->src));
		printf("dst mac		: "MAC_FORMAT"\n", MAC_PRINT(pkt->eth->dst));
	}

	if (pkt->eth_type == ETH_IP) {
		printf("IP frag		: %d\n", IP_FRAGOFF(pkt->ip));
		printf("src ip		: "IP_FORMAT"\n", IP_PRINT(pkt->ip->src));
		printf("dst ip		: "IP_FORMAT"\n", IP_PRINT(pkt->ip->dst));
	}

	if (pkt->ip_proto == IPPROTO_TCP) {
		printf("TCP flag	: ");

		for (int i = 0; m_tcp_flag[i].k != NULL; i++) {
			if (TCP_FLAG(pkt, m_tcp_flag[i].v)) {
				printf("[%s]", m_tcp_flag[i].k);
			}
		}

		printf("\n");
		printf("src port	: %u\n", ntohs(pkt->tcp->src));
		printf("dst port	: %u\n", ntohs(pkt->tcp->dst));

	} else if (pkt->ip_proto == IPPROTO_UDP) {
		printf("UDP\n");
		printf("src port	: %u\n", ntohs(pkt->udp->src));
		printf("dst port	: %u\n", ntohs(pkt->udp->dst));
	}

	if (pkt->payload > 0) {
		printf("--------------------------------------------------\n");

		for (int i = pkt->offset; i < pkt->len; i++) {
			printf("%c", pkt->data[i]);
		}
		printf("\n");
	}

	printf("--------------------------------------------------\n");
}